

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *iEnd;
  undefined8 *puVar5;
  ulong *puVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  undefined8 uVar15;
  long lVar16;
  U32 lowestValid;
  int iVar17;
  ulong uVar18;
  size_t sVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  BYTE *pBVar24;
  byte bVar25;
  U32 UVar26;
  U32 UVar27;
  uint uVar28;
  ulong *puVar29;
  ulong *puVar30;
  ulong *puVar31;
  BYTE *pBVar32;
  BYTE *pBVar33;
  ulong *puVar34;
  seqDef *psVar35;
  int iVar36;
  U32 UVar37;
  uint uVar38;
  long lVar39;
  uint uVar40;
  uint uVar41;
  BYTE *iStart;
  uint uVar42;
  uint uVar43;
  ulong uVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  BYTE *base;
  int iVar48;
  BYTE *pStart_3;
  BYTE *pStart;
  BYTE *pInLoopLimit;
  U32 maxDistance;
  BYTE *litLimit_w;
  ulong *local_160;
  ulong local_150;
  ulong local_100;
  ulong local_e0;
  uint local_d4;
  ulong *local_80;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar6 = (ulong *)((long)src + (srcSize - 8));
  pBVar11 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  iStart = pBVar11 + uVar8;
  uVar47 = *rep;
  local_d4 = rep[1];
  local_160 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  local_80 = (ulong *)src;
  if (local_160 < puVar6) {
    pBVar12 = (ms->window).dictBase;
    puVar29 = (ulong *)(pBVar12 + uVar8);
    uVar9 = (ms->window).lowLimit;
    uVar40 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    iVar17 = uVar8 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    puVar4 = iEnd + -4;
    do {
      iVar48 = (int)local_160 - (int)pBVar11;
      iVar45 = iVar48 + 1;
      UVar37 = (ms->window).lowLimit;
      UVar27 = ms->loadedDictEnd;
      UVar26 = iVar45 - uVar40;
      if (iVar45 - UVar37 <= uVar40) {
        UVar26 = UVar37;
      }
      if (UVar27 != 0) {
        UVar26 = UVar37;
      }
      uVar46 = iVar45 - uVar47;
      pBVar32 = pBVar11;
      if (uVar46 < uVar8) {
        pBVar32 = pBVar12;
      }
      if (iVar17 - uVar46 < 3) {
LAB_00661812:
        uVar18 = 0;
      }
      else {
        uVar18 = 0;
        if (uVar47 < (iVar48 - UVar26) + 1) {
          if (*(int *)((long)local_160 + 1U) != *(int *)(pBVar32 + uVar46)) goto LAB_00661812;
          puVar30 = iEnd;
          if (uVar46 < uVar8) {
            puVar30 = puVar29;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)local_160 + 5),(BYTE *)((long)(pBVar32 + uVar46) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar30,iStart);
          uVar18 = sVar19 + 4;
        }
      }
      uVar46 = (ms->cParams).minMatch;
      if (uVar46 - 6 < 2) {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar41 = 1 << (bVar7 & 0x1f);
        pBVar32 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar46 = (ms->window).dictLimit;
        uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar28 = (uint)((long)local_160 - (long)pBVar32);
        UVar26 = uVar28 - uVar38;
        if (uVar28 - UVar37 <= uVar38) {
          UVar26 = UVar37;
        }
        if (UVar27 != 0) {
          UVar26 = UVar37;
        }
        uVar38 = uVar28 - uVar41;
        if (uVar28 < uVar41) {
          uVar38 = 0;
        }
        iVar45 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar13 = ms->chainTable;
        pUVar14 = ms->hashTable;
        uVar20 = (ulong)ms->nextToUpdate;
        bVar25 = 0x40 - (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar28) {
          do {
            uVar44 = (ulong)(*(long *)(pBVar32 + uVar20) * -0x30e4432340650000) >> (bVar25 & 0x3f);
            pUVar13[(uint)uVar20 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar44];
            pUVar14[uVar44] = (uint)uVar20;
            uVar20 = uVar20 + 1;
          } while (uVar20 < ((long)local_160 - (long)pBVar32 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar28;
        uVar20 = *local_160;
        uVar42 = pUVar14[uVar20 * -0x30e4432340650000 >> (bVar25 & 0x3f)];
        if (UVar26 <= uVar42) {
          local_e0 = 999999999;
          uVar44 = 3;
          do {
            uVar21 = (ulong)uVar42;
            if (uVar42 < uVar46) {
              if (*(int *)(pBVar24 + uVar21) == (int)*local_160) {
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_160 + 4),pBVar24 + uVar21 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar46,pBVar32 + uVar46);
                uVar21 = sVar19 + 4;
LAB_00661ad7:
                if ((uVar44 < uVar21) &&
                   (local_e0 = (ulong)((uVar28 + 2) - uVar42), uVar44 = uVar21,
                   (ulong *)((long)local_160 + uVar21) == iEnd)) goto LAB_006620ea;
              }
            }
            else {
              puVar30 = (ulong *)(pBVar32 + uVar21);
              if (*(BYTE *)(uVar44 + (long)puVar30) == *(BYTE *)((long)local_160 + uVar44)) {
                puVar34 = local_160;
                if (local_160 < puVar1) {
                  if (*puVar30 == uVar20) {
                    lVar39 = 0;
                    do {
                      puVar34 = (ulong *)((long)local_160 + lVar39 + 8);
                      if (puVar1 <= puVar34) {
                        puVar30 = (ulong *)(pBVar32 + lVar39 + uVar21 + 8);
                        goto LAB_00661a91;
                      }
                      lVar16 = lVar39 + uVar21 + 8;
                      lVar39 = lVar39 + 8;
                    } while (*(ulong *)(pBVar32 + lVar16) == *puVar34);
                    uVar22 = *puVar34 ^ *(ulong *)(pBVar32 + lVar16);
                    uVar21 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar39;
                  }
                  else {
                    uVar22 = *puVar30 ^ uVar20;
                    uVar21 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = uVar21 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00661a91:
                  if ((puVar34 < puVar2) && ((int)*puVar30 == (int)*puVar34)) {
                    puVar34 = (ulong *)((long)puVar34 + 4);
                    puVar30 = (ulong *)((long)puVar30 + 4);
                  }
                  if ((puVar34 < puVar3) && ((short)*puVar30 == (short)*puVar34)) {
                    puVar34 = (ulong *)((long)puVar34 + 2);
                    puVar30 = (ulong *)((long)puVar30 + 2);
                  }
                  if (puVar34 < iEnd) {
                    puVar34 = (ulong *)((long)puVar34 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar34));
                  }
                  uVar21 = (long)puVar34 - (long)local_160;
                }
                goto LAB_00661ad7;
              }
            }
            uVar21 = uVar44;
            if ((uVar42 <= uVar38) ||
               ((iVar45 = iVar45 + -1, iVar45 == 0 ||
                (uVar42 = pUVar13[uVar42 & uVar41 - 1], uVar44 = uVar21, uVar42 < UVar26))))
            goto LAB_006620ea;
          } while( true );
        }
      }
      else if (uVar46 == 5) {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar41 = 1 << (bVar7 & 0x1f);
        pBVar32 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar46 = (ms->window).dictLimit;
        uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar28 = (uint)((long)local_160 - (long)pBVar32);
        UVar26 = uVar28 - uVar38;
        if (uVar28 - UVar37 <= uVar38) {
          UVar26 = UVar37;
        }
        if (UVar27 != 0) {
          UVar26 = UVar37;
        }
        uVar38 = uVar28 - uVar41;
        if (uVar28 < uVar41) {
          uVar38 = 0;
        }
        iVar45 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar13 = ms->chainTable;
        pUVar14 = ms->hashTable;
        uVar20 = (ulong)ms->nextToUpdate;
        bVar25 = 0x40 - (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar28) {
          do {
            uVar44 = (ulong)(*(long *)(pBVar32 + uVar20) * -0x30e4432345000000) >> (bVar25 & 0x3f);
            pUVar13[(uint)uVar20 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar44];
            pUVar14[uVar44] = (uint)uVar20;
            uVar20 = uVar20 + 1;
          } while (uVar20 < ((long)local_160 - (long)pBVar32 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar28;
        uVar20 = *local_160;
        uVar42 = pUVar14[uVar20 * -0x30e4432345000000 >> (bVar25 & 0x3f)];
        if (UVar26 <= uVar42) {
          local_e0 = 999999999;
          uVar44 = 3;
          do {
            uVar21 = (ulong)uVar42;
            if (uVar42 < uVar46) {
              if (*(int *)(pBVar24 + uVar21) == (int)*local_160) {
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_160 + 4),pBVar24 + uVar21 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar46,pBVar32 + uVar46);
                uVar21 = sVar19 + 4;
LAB_00661dba:
                if ((uVar44 < uVar21) &&
                   (local_e0 = (ulong)((uVar28 + 2) - uVar42), uVar44 = uVar21,
                   (ulong *)((long)local_160 + uVar21) == iEnd)) goto LAB_006620ea;
              }
            }
            else {
              puVar30 = (ulong *)(pBVar32 + uVar21);
              if (*(BYTE *)(uVar44 + (long)puVar30) == *(BYTE *)((long)local_160 + uVar44)) {
                puVar34 = local_160;
                if (local_160 < puVar1) {
                  if (*puVar30 == uVar20) {
                    lVar39 = 0;
                    do {
                      puVar34 = (ulong *)((long)local_160 + lVar39 + 8);
                      if (puVar1 <= puVar34) {
                        puVar30 = (ulong *)(pBVar32 + lVar39 + uVar21 + 8);
                        goto LAB_00661d74;
                      }
                      lVar16 = lVar39 + uVar21 + 8;
                      lVar39 = lVar39 + 8;
                    } while (*(ulong *)(pBVar32 + lVar16) == *puVar34);
                    uVar22 = *puVar34 ^ *(ulong *)(pBVar32 + lVar16);
                    uVar21 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar39;
                  }
                  else {
                    uVar22 = *puVar30 ^ uVar20;
                    uVar21 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = uVar21 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_00661d74:
                  if ((puVar34 < puVar2) && ((int)*puVar30 == (int)*puVar34)) {
                    puVar34 = (ulong *)((long)puVar34 + 4);
                    puVar30 = (ulong *)((long)puVar30 + 4);
                  }
                  if ((puVar34 < puVar3) && ((short)*puVar30 == (short)*puVar34)) {
                    puVar34 = (ulong *)((long)puVar34 + 2);
                    puVar30 = (ulong *)((long)puVar30 + 2);
                  }
                  if (puVar34 < iEnd) {
                    puVar34 = (ulong *)((long)puVar34 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar34));
                  }
                  uVar21 = (long)puVar34 - (long)local_160;
                }
                goto LAB_00661dba;
              }
            }
            uVar21 = uVar44;
            if ((uVar42 <= uVar38) ||
               ((iVar45 = iVar45 + -1, iVar45 == 0 ||
                (uVar42 = pUVar13[uVar42 & uVar41 - 1], uVar44 = uVar21, uVar42 < UVar26))))
            goto LAB_006620ea;
          } while( true );
        }
      }
      else {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar41 = 1 << (bVar7 & 0x1f);
        pBVar32 = (ms->window).base;
        pBVar24 = (ms->window).dictBase;
        uVar46 = (ms->window).dictLimit;
        uVar38 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar28 = (uint)((long)local_160 - (long)pBVar32);
        UVar26 = uVar28 - uVar38;
        if (uVar28 - UVar37 <= uVar38) {
          UVar26 = UVar37;
        }
        if (UVar27 != 0) {
          UVar26 = UVar37;
        }
        uVar38 = uVar28 - uVar41;
        if (uVar28 < uVar41) {
          uVar38 = 0;
        }
        iVar45 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar13 = ms->chainTable;
        pUVar14 = ms->hashTable;
        uVar20 = (ulong)ms->nextToUpdate;
        bVar25 = 0x20 - (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar28) {
          do {
            uVar42 = (uint)(*(int *)(pBVar32 + uVar20) * -0x61c8864f) >> (bVar25 & 0x1f);
            pUVar13[(uint)uVar20 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar42];
            pUVar14[uVar42] = (uint)uVar20;
            uVar20 = uVar20 + 1;
          } while (uVar20 < ((long)local_160 - (long)pBVar32 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar28;
        uVar20 = *local_160;
        uVar42 = pUVar14[(uint)((int)uVar20 * -0x61c8864f) >> (bVar25 & 0x1f)];
        if (UVar26 <= uVar42) {
          local_e0 = 999999999;
          uVar44 = 3;
          do {
            uVar21 = (ulong)uVar42;
            if (uVar42 < uVar46) {
              if (*(int *)(pBVar24 + uVar21) == (int)uVar20) {
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_160 + 4),pBVar24 + uVar21 + 4,(BYTE *)iEnd,
                                    pBVar24 + uVar46,pBVar32 + uVar46);
                uVar21 = sVar19 + 4;
LAB_006620a4:
                if ((uVar44 < uVar21) &&
                   (local_e0 = (ulong)((uVar28 + 2) - uVar42), uVar44 = uVar21,
                   (ulong *)((long)local_160 + uVar21) == iEnd)) goto LAB_006620ea;
              }
            }
            else {
              puVar30 = (ulong *)(pBVar32 + uVar21);
              if (*(BYTE *)(uVar44 + (long)puVar30) == *(BYTE *)((long)local_160 + uVar44)) {
                puVar34 = local_160;
                if (local_160 < puVar1) {
                  if (*puVar30 == *local_160) {
                    lVar39 = 0;
                    do {
                      puVar34 = (ulong *)((long)local_160 + lVar39 + 8);
                      if (puVar1 <= puVar34) {
                        puVar30 = (ulong *)(pBVar32 + lVar39 + uVar21 + 8);
                        goto LAB_0066205e;
                      }
                      lVar16 = lVar39 + uVar21 + 8;
                      lVar39 = lVar39 + 8;
                    } while (*(ulong *)(pBVar32 + lVar16) == *puVar34);
                    uVar22 = *puVar34 ^ *(ulong *)(pBVar32 + lVar16);
                    uVar21 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar39;
                  }
                  else {
                    uVar22 = *local_160 ^ *puVar30;
                    uVar21 = 0;
                    if (uVar22 != 0) {
                      for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                      }
                    }
                    uVar21 = uVar21 >> 3 & 0x1fffffff;
                  }
                }
                else {
LAB_0066205e:
                  if ((puVar34 < puVar2) && ((int)*puVar30 == (int)*puVar34)) {
                    puVar34 = (ulong *)((long)puVar34 + 4);
                    puVar30 = (ulong *)((long)puVar30 + 4);
                  }
                  if ((puVar34 < puVar3) && ((short)*puVar30 == (short)*puVar34)) {
                    puVar34 = (ulong *)((long)puVar34 + 2);
                    puVar30 = (ulong *)((long)puVar30 + 2);
                  }
                  if (puVar34 < iEnd) {
                    puVar34 = (ulong *)((long)puVar34 + (ulong)((BYTE)*puVar30 == (BYTE)*puVar34));
                  }
                  uVar21 = (long)puVar34 - (long)local_160;
                }
                goto LAB_006620a4;
              }
            }
            uVar21 = uVar44;
            if ((uVar42 <= uVar38) ||
               ((iVar45 = iVar45 + -1, iVar45 == 0 ||
                (uVar42 = pUVar13[uVar42 & uVar41 - 1], uVar44 = uVar21, uVar42 < UVar26))))
            goto LAB_006620ea;
          } while( true );
        }
      }
      uVar21 = 3;
      local_e0 = 999999999;
LAB_006620ea:
      local_100 = uVar18;
      if (uVar18 < uVar21) {
        local_100 = uVar21;
      }
      if (local_100 < 4) {
        local_160 = (ulong *)((long)local_160 + ((long)local_160 - (long)local_80 >> 8) + 1);
      }
      else {
        puVar30 = local_160;
        if (uVar21 <= uVar18) {
          local_e0 = 0;
          puVar30 = (ulong *)((long)local_160 + 1U);
        }
        if (local_160 < puVar6) {
LAB_00662189:
          puVar34 = (ulong *)((long)local_160 + 1);
          iVar45 = iVar48 + 1;
          if (local_e0 == 0) {
            local_e0 = 0;
          }
          else {
            UVar37 = (ms->window).lowLimit;
            UVar27 = iVar45 - uVar40;
            if (iVar45 - UVar37 <= uVar40) {
              UVar27 = UVar37;
            }
            if (ms->loadedDictEnd != 0) {
              UVar27 = UVar37;
            }
            uVar46 = iVar45 - uVar47;
            pBVar32 = pBVar11;
            if (uVar46 < uVar8) {
              pBVar32 = pBVar12;
            }
            if (((2 < iVar17 - uVar46) && (uVar47 < iVar45 - UVar27)) &&
               (*(int *)puVar34 == *(int *)(pBVar32 + uVar46))) {
              puVar31 = iEnd;
              if (uVar46 < uVar8) {
                puVar31 = puVar29;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_160 + 5),
                                  (BYTE *)((long)(pBVar32 + uVar46) + 4),(BYTE *)iEnd,
                                  (BYTE *)puVar31,iStart);
              if (sVar19 < 0xfffffffffffffffc) {
                uVar28 = (int)local_e0 + 1;
                uVar46 = 0x1f;
                if (uVar28 != 0) {
                  for (; uVar28 >> uVar46 == 0; uVar46 = uVar46 - 1) {
                  }
                }
                if ((int)((uVar46 ^ 0x1f) + (int)local_100 * 3 + -0x1e) < (int)(sVar19 + 4) * 3) {
                  local_e0 = 0;
                  puVar30 = puVar34;
                  local_100 = sVar19 + 4;
                }
              }
            }
          }
          uVar46 = (ms->cParams).minMatch;
          if (uVar46 - 6 < 2) {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar38 = 1 << (bVar7 & 0x1f);
            pBVar32 = (ms->window).base;
            uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar37 = (ms->window).lowLimit;
            uVar46 = (uint)((long)puVar34 - (long)pBVar32);
            UVar27 = uVar46 - uVar28;
            if (uVar46 - UVar37 <= uVar28) {
              UVar27 = UVar37;
            }
            pUVar13 = ms->chainTable;
            pBVar24 = (ms->window).dictBase;
            if (ms->loadedDictEnd != 0) {
              UVar27 = UVar37;
            }
            uVar28 = uVar46 - uVar38;
            if (uVar46 < uVar38) {
              uVar28 = 0;
            }
            iVar36 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            uVar41 = (ms->window).dictLimit;
            pUVar14 = ms->hashTable;
            uVar18 = (ulong)ms->nextToUpdate;
            bVar25 = 0x40 - (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar46) {
              do {
                uVar20 = (ulong)(*(long *)(pBVar32 + uVar18) * -0x30e4432340650000) >>
                         (bVar25 & 0x3f);
                pUVar13[(uint)uVar18 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar20];
                pUVar14[uVar20] = (uint)uVar18;
                uVar18 = uVar18 + 1;
              } while (((long)puVar34 - (long)pBVar32 & 0xffffffffU) != uVar18);
            }
            ms->nextToUpdate = uVar46;
            uVar18 = *puVar34;
            uVar42 = pUVar14[uVar18 * -0x30e4432340650000 >> (bVar25 & 0x3f)];
            if (UVar27 <= uVar42) {
              local_150 = 999999999;
              uVar20 = 3;
              do {
                uVar44 = (ulong)uVar42;
                if (uVar42 < uVar41) {
                  if (*(int *)(pBVar24 + uVar44) == *(int *)puVar34) {
                    sVar19 = ZSTD_count_2segments
                                       ((BYTE *)((long)local_160 + 5),pBVar24 + uVar44 + 4,
                                        (BYTE *)iEnd,pBVar24 + uVar41,pBVar32 + uVar41);
                    uVar44 = sVar19 + 4;
LAB_0066255c:
                    if ((uVar20 < uVar44) &&
                       (local_150 = (ulong)((uVar46 + 2) - uVar42), uVar20 = uVar44,
                       (ulong *)((long)puVar34 + uVar44) == iEnd)) goto LAB_00662bfd;
                  }
                }
                else {
                  puVar31 = (ulong *)(pBVar32 + uVar44);
                  if (*(BYTE *)(uVar20 + (long)puVar31) == *(BYTE *)((long)puVar34 + uVar20)) {
                    puVar23 = puVar34;
                    if (puVar34 < puVar1) {
                      if (*puVar31 == uVar18) {
                        lVar39 = 0;
                        do {
                          puVar23 = (ulong *)((long)local_160 + lVar39 + 9);
                          if (puVar1 <= puVar23) {
                            puVar31 = (ulong *)(pBVar32 + lVar39 + uVar44 + 8);
                            goto LAB_00662514;
                          }
                          lVar16 = lVar39 + uVar44 + 8;
                          lVar39 = lVar39 + 8;
                        } while (*(ulong *)(pBVar32 + lVar16) == *puVar23);
                        uVar21 = *puVar23 ^ *(ulong *)(pBVar32 + lVar16);
                        uVar44 = 0;
                        if (uVar21 != 0) {
                          for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                          }
                        }
                        uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar39;
                      }
                      else {
                        uVar21 = *puVar31 ^ uVar18;
                        uVar44 = 0;
                        if (uVar21 != 0) {
                          for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                          }
                        }
                        uVar44 = uVar44 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00662514:
                      if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 4);
                        puVar31 = (ulong *)((long)puVar31 + 4);
                      }
                      if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 2);
                        puVar31 = (ulong *)((long)puVar31 + 2);
                      }
                      if (puVar23 < iEnd) {
                        puVar23 = (ulong *)((long)puVar23 +
                                           (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                      }
                      uVar44 = (long)puVar23 - (long)puVar34;
                    }
                    goto LAB_0066255c;
                  }
                }
                uVar44 = uVar20;
                if ((uVar42 <= uVar28) ||
                   ((iVar36 = iVar36 + -1, iVar36 == 0 ||
                    (uVar42 = pUVar13[uVar42 & uVar38 - 1], uVar20 = uVar44, uVar42 < UVar27))))
                goto LAB_00662bfd;
              } while( true );
            }
          }
          else if (uVar46 == 5) {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar38 = 1 << (bVar7 & 0x1f);
            pBVar32 = (ms->window).base;
            uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar37 = (ms->window).lowLimit;
            uVar46 = (uint)((long)puVar34 - (long)pBVar32);
            UVar27 = uVar46 - uVar28;
            if (uVar46 - UVar37 <= uVar28) {
              UVar27 = UVar37;
            }
            pUVar13 = ms->chainTable;
            pBVar24 = (ms->window).dictBase;
            if (ms->loadedDictEnd != 0) {
              UVar27 = UVar37;
            }
            uVar28 = uVar46 - uVar38;
            if (uVar46 < uVar38) {
              uVar28 = 0;
            }
            iVar36 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            uVar41 = (ms->window).dictLimit;
            pUVar14 = ms->hashTable;
            uVar18 = (ulong)ms->nextToUpdate;
            bVar25 = 0x40 - (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar46) {
              do {
                uVar20 = (ulong)(*(long *)(pBVar32 + uVar18) * -0x30e4432345000000) >>
                         (bVar25 & 0x3f);
                pUVar13[(uint)uVar18 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar20];
                pUVar14[uVar20] = (uint)uVar18;
                uVar18 = uVar18 + 1;
              } while (((long)puVar34 - (long)pBVar32 & 0xffffffffU) != uVar18);
            }
            ms->nextToUpdate = uVar46;
            uVar18 = *puVar34;
            uVar42 = pUVar14[uVar18 * -0x30e4432345000000 >> (bVar25 & 0x3f)];
            if (UVar27 <= uVar42) {
              local_150 = 999999999;
              uVar20 = 3;
              do {
                uVar44 = (ulong)uVar42;
                if (uVar42 < uVar41) {
                  if (*(int *)(pBVar24 + uVar44) == *(int *)puVar34) {
                    sVar19 = ZSTD_count_2segments
                                       ((BYTE *)((long)local_160 + 5),pBVar24 + uVar44 + 4,
                                        (BYTE *)iEnd,pBVar24 + uVar41,pBVar32 + uVar41);
                    uVar44 = sVar19 + 4;
LAB_0066286d:
                    if ((uVar20 < uVar44) &&
                       (local_150 = (ulong)((uVar46 + 2) - uVar42), uVar20 = uVar44,
                       (ulong *)((long)puVar34 + uVar44) == iEnd)) goto LAB_00662bfd;
                  }
                }
                else {
                  puVar31 = (ulong *)(pBVar32 + uVar44);
                  if (*(BYTE *)(uVar20 + (long)puVar31) == *(BYTE *)((long)puVar34 + uVar20)) {
                    puVar23 = puVar34;
                    if (puVar34 < puVar1) {
                      if (*puVar31 == uVar18) {
                        lVar39 = 0;
                        do {
                          puVar23 = (ulong *)((long)local_160 + lVar39 + 9);
                          if (puVar1 <= puVar23) {
                            puVar31 = (ulong *)(pBVar32 + lVar39 + uVar44 + 8);
                            goto LAB_00662825;
                          }
                          lVar16 = lVar39 + uVar44 + 8;
                          lVar39 = lVar39 + 8;
                        } while (*(ulong *)(pBVar32 + lVar16) == *puVar23);
                        uVar21 = *puVar23 ^ *(ulong *)(pBVar32 + lVar16);
                        uVar44 = 0;
                        if (uVar21 != 0) {
                          for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                          }
                        }
                        uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar39;
                      }
                      else {
                        uVar21 = *puVar31 ^ uVar18;
                        uVar44 = 0;
                        if (uVar21 != 0) {
                          for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                          }
                        }
                        uVar44 = uVar44 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00662825:
                      if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 4);
                        puVar31 = (ulong *)((long)puVar31 + 4);
                      }
                      if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 2);
                        puVar31 = (ulong *)((long)puVar31 + 2);
                      }
                      if (puVar23 < iEnd) {
                        puVar23 = (ulong *)((long)puVar23 +
                                           (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                      }
                      uVar44 = (long)puVar23 - (long)puVar34;
                    }
                    goto LAB_0066286d;
                  }
                }
                uVar44 = uVar20;
                if ((uVar42 <= uVar28) ||
                   ((iVar36 = iVar36 + -1, iVar36 == 0 ||
                    (uVar42 = pUVar13[uVar42 & uVar38 - 1], uVar20 = uVar44, uVar42 < UVar27))))
                goto LAB_00662bfd;
              } while( true );
            }
          }
          else {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar42 = 1 << (bVar7 & 0x1f);
            pBVar32 = (ms->window).base;
            uVar41 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            uVar46 = (ms->window).lowLimit;
            uVar38 = (uint)((long)puVar34 - (long)pBVar32);
            uVar28 = uVar38 - uVar41;
            if (uVar38 - uVar46 <= uVar41) {
              uVar28 = uVar46;
            }
            pUVar13 = ms->chainTable;
            pBVar24 = (ms->window).dictBase;
            if (ms->loadedDictEnd != 0) {
              uVar28 = uVar46;
            }
            uVar46 = uVar38 - uVar42;
            if (uVar38 < uVar42) {
              uVar46 = 0;
            }
            iVar36 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            uVar41 = (ms->window).dictLimit;
            pUVar14 = ms->hashTable;
            uVar18 = (ulong)ms->nextToUpdate;
            bVar25 = 0x20 - (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar38) {
              do {
                uVar43 = (uint)(*(int *)(pBVar32 + uVar18) * -0x61c8864f) >> (bVar25 & 0x1f);
                pUVar13[(uint)uVar18 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar43];
                pUVar14[uVar43] = (uint)uVar18;
                uVar18 = uVar18 + 1;
              } while (((long)puVar34 - (long)pBVar32 & 0xffffffffU) != uVar18);
            }
            ms->nextToUpdate = uVar38;
            iVar10 = *(int *)puVar34;
            uVar43 = pUVar14[(uint)(iVar10 * -0x61c8864f) >> (bVar25 & 0x1f)];
            if (uVar28 <= uVar43) {
              local_150 = 999999999;
              uVar18 = 3;
              do {
                uVar20 = (ulong)uVar43;
                if (uVar43 < uVar41) {
                  if (*(int *)(pBVar24 + uVar20) == iVar10) {
                    sVar19 = ZSTD_count_2segments
                                       ((BYTE *)((long)local_160 + 5),pBVar24 + uVar20 + 4,
                                        (BYTE *)iEnd,pBVar24 + uVar41,pBVar32 + uVar41);
                    uVar44 = sVar19 + 4;
LAB_00662bad:
                    if ((uVar18 < uVar44) &&
                       (local_150 = (ulong)((uVar38 + 2) - uVar43), uVar18 = uVar44,
                       (ulong *)((long)puVar34 + uVar44) == iEnd)) goto LAB_00662bfd;
                  }
                }
                else {
                  puVar31 = (ulong *)(pBVar32 + uVar20);
                  if (*(BYTE *)(uVar18 + (long)puVar31) == *(BYTE *)((long)puVar34 + uVar18)) {
                    puVar23 = puVar34;
                    if (puVar34 < puVar1) {
                      if (*puVar31 == *puVar34) {
                        lVar39 = 0;
                        do {
                          puVar23 = (ulong *)((long)local_160 + lVar39 + 9);
                          if (puVar1 <= puVar23) {
                            puVar31 = (ulong *)(pBVar32 + lVar39 + uVar20 + 8);
                            goto LAB_00662b52;
                          }
                          lVar16 = lVar39 + uVar20 + 8;
                          lVar39 = lVar39 + 8;
                        } while (*(ulong *)(pBVar32 + lVar16) == *puVar23);
                        uVar44 = *puVar23 ^ *(ulong *)(pBVar32 + lVar16);
                        uVar20 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                          }
                        }
                        uVar44 = (uVar20 >> 3 & 0x1fffffff) + lVar39;
                      }
                      else {
                        uVar44 = *puVar34 ^ *puVar31;
                        uVar20 = 0;
                        if (uVar44 != 0) {
                          for (; (uVar44 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                          }
                        }
                        uVar44 = uVar20 >> 3 & 0x1fffffff;
                      }
                    }
                    else {
LAB_00662b52:
                      if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 4);
                        puVar31 = (ulong *)((long)puVar31 + 4);
                      }
                      if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                        puVar23 = (ulong *)((long)puVar23 + 2);
                        puVar31 = (ulong *)((long)puVar31 + 2);
                      }
                      if (puVar23 < iEnd) {
                        puVar23 = (ulong *)((long)puVar23 +
                                           (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                      }
                      uVar44 = (long)puVar23 - (long)puVar34;
                    }
                    goto LAB_00662bad;
                  }
                }
                uVar44 = uVar18;
                if ((uVar43 <= uVar46) ||
                   ((iVar36 = iVar36 + -1, iVar36 == 0 ||
                    (uVar43 = pUVar13[uVar43 & uVar42 - 1], uVar18 = uVar44, uVar43 < uVar28))))
                goto LAB_00662bfd;
              } while( true );
            }
          }
          goto LAB_00662c5a;
        }
LAB_006637f4:
        if (local_e0 == 0) {
          UVar37 = 1;
          uVar46 = uVar47;
        }
        else {
          pBVar33 = (BYTE *)((long)puVar30 + (2 - (long)(pBVar11 + local_e0)));
          pBVar24 = iStart;
          pBVar32 = pBVar11;
          if ((uint)pBVar33 < uVar8) {
            pBVar24 = pBVar12 + uVar9;
            pBVar32 = pBVar12;
          }
          if ((local_80 < puVar30) &&
             (uVar18 = (ulong)pBVar33 & 0xffffffff, pBVar24 < pBVar32 + uVar18)) {
            pBVar32 = pBVar32 + uVar18;
            do {
              pBVar32 = pBVar32 + -1;
              puVar34 = (ulong *)((long)puVar30 + -1);
              if ((*(BYTE *)puVar34 != *pBVar32) ||
                 (local_100 = local_100 + 1, puVar30 = puVar34, puVar34 <= local_80)) break;
            } while (pBVar24 < pBVar32);
          }
          UVar37 = (int)local_e0 + 1;
          uVar46 = (int)local_e0 - 2;
          local_d4 = uVar47;
        }
        uVar18 = (long)puVar30 - (long)local_80;
        puVar34 = (ulong *)seqStore->lit;
        if (puVar4 < puVar30) {
          puVar31 = puVar34;
          puVar23 = local_80;
          if (local_80 <= puVar4) {
            puVar31 = (ulong *)((long)puVar34 + ((long)puVar4 - (long)local_80));
            uVar20 = local_80[1];
            *puVar34 = *local_80;
            puVar34[1] = uVar20;
            puVar23 = puVar4;
            if (0x10 < (long)puVar4 - (long)local_80) {
              lVar39 = 0x10;
              do {
                uVar15 = *(undefined8 *)((BYTE *)((long)local_80 + lVar39) + 8);
                puVar5 = (undefined8 *)((long)puVar34 + lVar39);
                *puVar5 = *(undefined8 *)((long)local_80 + lVar39);
                puVar5[1] = uVar15;
                pBVar32 = (BYTE *)((long)local_80 + lVar39 + 0x10);
                uVar15 = *(undefined8 *)(pBVar32 + 8);
                puVar5[2] = *(undefined8 *)pBVar32;
                puVar5[3] = uVar15;
                lVar39 = lVar39 + 0x20;
              } while (puVar5 + 4 < puVar31);
            }
          }
          if (puVar23 < puVar30) {
            lVar39 = 0;
            do {
              *(BYTE *)((long)puVar31 + lVar39) = *(BYTE *)((long)puVar23 + lVar39);
              lVar39 = lVar39 + 1;
            } while ((long)puVar30 - (long)puVar23 != lVar39);
          }
LAB_006639a3:
          seqStore->lit = seqStore->lit + uVar18;
          psVar35 = seqStore->sequences;
          if (0xffff < uVar18) {
            seqStore->longLengthType = ZSTD_llt_literalLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          uVar20 = local_80[1];
          *puVar34 = *local_80;
          puVar34[1] = uVar20;
          pBVar32 = seqStore->lit;
          if (0x10 < uVar18) {
            uVar20 = local_80[3];
            *(ulong *)(pBVar32 + 0x10) = local_80[2];
            *(ulong *)(pBVar32 + 0x18) = uVar20;
            if (0x20 < (long)uVar18) {
              lVar39 = 0;
              do {
                pBVar33 = (BYTE *)((long)local_80 + lVar39 + 0x20);
                uVar15 = *(undefined8 *)(pBVar33 + 8);
                pBVar24 = pBVar32 + lVar39 + 0x20;
                *(undefined8 *)pBVar24 = *(undefined8 *)pBVar33;
                *(undefined8 *)(pBVar24 + 8) = uVar15;
                pBVar33 = (BYTE *)((long)local_80 + lVar39 + 0x30);
                uVar15 = *(undefined8 *)(pBVar33 + 8);
                *(undefined8 *)(pBVar24 + 0x10) = *(undefined8 *)pBVar33;
                *(undefined8 *)(pBVar24 + 0x18) = uVar15;
                lVar39 = lVar39 + 0x20;
              } while (pBVar24 + 0x20 < pBVar32 + uVar18);
            }
            goto LAB_006639a3;
          }
          seqStore->lit = pBVar32 + uVar18;
          psVar35 = seqStore->sequences;
        }
        psVar35->litLength = (U16)uVar18;
        psVar35->offset = UVar37;
        if (0xffff < local_100 - 3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar35->matchLength = (U16)(local_100 - 3);
        psVar35 = psVar35 + 1;
        seqStore->sequences = psVar35;
        for (local_160 = (ulong *)((long)puVar30 + local_100); uVar47 = uVar46, local_80 = local_160
            , local_160 <= puVar6; local_160 = (ulong *)((long)local_160 + sVar19 + 4)) {
          iVar45 = (int)local_160 - (int)pBVar11;
          UVar37 = (ms->window).lowLimit;
          UVar27 = iVar45 - uVar40;
          if (iVar45 - UVar37 <= uVar40) {
            UVar27 = UVar37;
          }
          if (ms->loadedDictEnd != 0) {
            UVar27 = UVar37;
          }
          uVar46 = iVar45 - local_d4;
          pBVar32 = pBVar11;
          if (uVar46 < uVar8) {
            pBVar32 = pBVar12;
          }
          if (((iVar17 - uVar46 < 3) || (iVar45 - UVar27 <= local_d4)) ||
             ((int)*local_160 != *(int *)(pBVar32 + uVar46))) break;
          puVar30 = iEnd;
          if (uVar46 < uVar8) {
            puVar30 = puVar29;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)local_160 + 4),(BYTE *)((long)(pBVar32 + uVar46) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar30,iStart);
          if (local_160 <= puVar4) {
            puVar30 = (ulong *)seqStore->lit;
            uVar18 = local_160[1];
            *puVar30 = *local_160;
            puVar30[1] = uVar18;
            psVar35 = seqStore->sequences;
          }
          psVar35->litLength = 0;
          psVar35->offset = 1;
          if (0xffff < sVar19 + 1) {
            seqStore->longLengthType = ZSTD_llt_matchLength;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar35 - (long)seqStore->sequencesStart) >> 3);
          }
          psVar35->matchLength = (U16)(sVar19 + 1);
          psVar35 = psVar35 + 1;
          seqStore->sequences = psVar35;
          uVar46 = local_d4;
          local_d4 = uVar47;
        }
      }
    } while (local_160 < puVar6);
  }
  *rep = uVar47;
  rep[1] = local_d4;
  return (long)iEnd - (long)local_80;
LAB_00662bfd:
  if (3 < uVar44) {
    uVar28 = (int)local_e0 + 1;
    uVar46 = 0x1f;
    if (uVar28 != 0) {
      for (; uVar28 >> uVar46 == 0; uVar46 = uVar46 - 1) {
      }
    }
    uVar28 = (int)local_150 + 1;
    iVar36 = 0x1f;
    if (uVar28 != 0) {
      for (; uVar28 >> iVar36 == 0; iVar36 = iVar36 + -1) {
      }
    }
    if ((int)((uVar46 ^ 0x1f) + (int)local_100 * 4 + -0x1b) < (int)uVar44 * 4 - iVar36)
    goto LAB_0066377f;
  }
LAB_00662c5a:
  if (puVar34 < puVar6) {
    puVar34 = (ulong *)((long)local_160 + 2);
    iVar45 = iVar48 + 2;
    if (local_e0 == 0) {
      local_e0 = 0;
    }
    else {
      UVar37 = (ms->window).lowLimit;
      UVar27 = iVar45 - uVar40;
      if (iVar45 - UVar37 <= uVar40) {
        UVar27 = UVar37;
      }
      if (ms->loadedDictEnd != 0) {
        UVar27 = UVar37;
      }
      uVar46 = iVar45 - uVar47;
      pBVar32 = pBVar11;
      if (uVar46 < uVar8) {
        pBVar32 = pBVar12;
      }
      if (((2 < iVar17 - uVar46) && (uVar47 < iVar45 - UVar27)) &&
         (*(int *)puVar34 == *(int *)(pBVar32 + uVar46))) {
        puVar31 = iEnd;
        if (uVar46 < uVar8) {
          puVar31 = puVar29;
        }
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)((long)local_160 + 6),(BYTE *)((long)(pBVar32 + uVar46) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar31,iStart);
        if (sVar19 < 0xfffffffffffffffc) {
          uVar28 = (int)local_e0 + 1;
          uVar46 = 0x1f;
          if (uVar28 != 0) {
            for (; uVar28 >> uVar46 == 0; uVar46 = uVar46 - 1) {
            }
          }
          if ((int)((uVar46 ^ 0x1f) + (int)local_100 * 4 + -0x1e) < (int)(sVar19 + 4) * 4) {
            local_e0 = 0;
            puVar30 = puVar34;
            local_100 = sVar19 + 4;
          }
        }
      }
    }
    uVar46 = (ms->cParams).minMatch;
    if (uVar46 - 6 < 2) {
      bVar7 = (byte)(ms->cParams).chainLog;
      uVar42 = 1 << (bVar7 & 0x1f);
      pBVar32 = (ms->window).base;
      uVar41 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar46 = (ms->window).lowLimit;
      uVar38 = (uint)((long)puVar34 - (long)pBVar32);
      uVar28 = uVar38 - uVar41;
      if (uVar38 - uVar46 <= uVar41) {
        uVar28 = uVar46;
      }
      pUVar13 = ms->chainTable;
      pBVar24 = (ms->window).dictBase;
      if (ms->loadedDictEnd != 0) {
        uVar28 = uVar46;
      }
      uVar46 = uVar38 - uVar42;
      if (uVar38 < uVar42) {
        uVar46 = 0;
      }
      iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar41 = (ms->window).dictLimit;
      pUVar14 = ms->hashTable;
      uVar18 = (ulong)ms->nextToUpdate;
      bVar25 = 0x40 - (char)(ms->cParams).hashLog;
      if (ms->nextToUpdate < uVar38) {
        do {
          uVar20 = (ulong)(*(long *)(pBVar32 + uVar18) * -0x30e4432340650000) >> (bVar25 & 0x3f);
          pUVar13[(uint)uVar18 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar20];
          pUVar14[uVar20] = (uint)uVar18;
          uVar18 = uVar18 + 1;
        } while (uVar18 < ((long)puVar34 - (long)pBVar32 & 0xffffffffU));
      }
      ms->nextToUpdate = uVar38;
      uVar18 = *puVar34;
      uVar43 = pUVar14[uVar18 * -0x30e4432340650000 >> (bVar25 & 0x3f)];
      if (uVar28 <= uVar43) {
        local_150 = 999999999;
        uVar20 = 3;
        do {
          uVar44 = (ulong)uVar43;
          if (uVar43 < uVar41) {
            if (*(int *)(pBVar24 + uVar44) == *(int *)puVar34) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_160 + 6),pBVar24 + uVar44 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar41,pBVar32 + uVar41);
              uVar44 = sVar19 + 4;
LAB_0066309d:
              if ((uVar20 < uVar44) &&
                 (local_150 = (ulong)((uVar38 + 2) - uVar43), uVar20 = uVar44,
                 (ulong *)((long)puVar34 + uVar44) == iEnd)) goto LAB_00663720;
            }
          }
          else {
            puVar31 = (ulong *)(pBVar32 + uVar44);
            if (*(BYTE *)(uVar20 + (long)puVar31) == *(BYTE *)((long)puVar34 + uVar20)) {
              puVar23 = puVar34;
              if (puVar34 < puVar1) {
                if (*puVar31 == uVar18) {
                  lVar39 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_160 + lVar39 + 10);
                    if (puVar1 <= puVar23) {
                      puVar31 = (ulong *)(pBVar32 + lVar39 + uVar44 + 8);
                      goto LAB_00663049;
                    }
                    lVar16 = lVar39 + uVar44 + 8;
                    lVar39 = lVar39 + 8;
                  } while (*(ulong *)(pBVar32 + lVar16) == *puVar23);
                  uVar21 = *puVar23 ^ *(ulong *)(pBVar32 + lVar16);
                  uVar44 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar39;
                }
                else {
                  uVar21 = *puVar31 ^ uVar18;
                  uVar44 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar44 = uVar44 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00663049:
                if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                }
                uVar44 = (long)puVar23 - (long)puVar34;
              }
              goto LAB_0066309d;
            }
          }
          uVar44 = uVar20;
          if ((uVar43 <= uVar46) ||
             ((iVar48 = iVar48 + -1, iVar48 == 0 ||
              (uVar43 = pUVar13[uVar43 & uVar42 - 1], uVar20 = uVar44, uVar43 < uVar28))))
          goto LAB_00663720;
        } while( true );
      }
    }
    else if (uVar46 == 5) {
      bVar7 = (byte)(ms->cParams).chainLog;
      uVar38 = 1 << (bVar7 & 0x1f);
      pBVar32 = (ms->window).base;
      uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar37 = (ms->window).lowLimit;
      uVar46 = (uint)((long)puVar34 - (long)pBVar32);
      UVar27 = uVar46 - uVar28;
      if (uVar46 - UVar37 <= uVar28) {
        UVar27 = UVar37;
      }
      pUVar13 = ms->chainTable;
      pBVar24 = (ms->window).dictBase;
      if (ms->loadedDictEnd != 0) {
        UVar27 = UVar37;
      }
      uVar28 = uVar46 - uVar38;
      if (uVar46 < uVar38) {
        uVar28 = 0;
      }
      iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar41 = (ms->window).dictLimit;
      pUVar14 = ms->hashTable;
      uVar18 = (ulong)ms->nextToUpdate;
      bVar25 = 0x40 - (char)(ms->cParams).hashLog;
      if (ms->nextToUpdate < uVar46) {
        do {
          uVar20 = (ulong)(*(long *)(pBVar32 + uVar18) * -0x30e4432345000000) >> (bVar25 & 0x3f);
          pUVar13[(uint)uVar18 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar20];
          pUVar14[uVar20] = (uint)uVar18;
          uVar18 = uVar18 + 1;
        } while (uVar18 < ((long)puVar34 - (long)pBVar32 & 0xffffffffU));
      }
      ms->nextToUpdate = uVar46;
      uVar18 = *puVar34;
      uVar42 = pUVar14[uVar18 * -0x30e4432345000000 >> (bVar25 & 0x3f)];
      if (UVar27 <= uVar42) {
        local_150 = 999999999;
        uVar20 = 3;
        do {
          uVar44 = (ulong)uVar42;
          if (uVar42 < uVar41) {
            if (*(int *)(pBVar24 + uVar44) == *(int *)puVar34) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_160 + 6),pBVar24 + uVar44 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar41,pBVar32 + uVar41);
              uVar44 = sVar19 + 4;
LAB_006633ba:
              if ((uVar20 < uVar44) &&
                 (local_150 = (ulong)((uVar46 + 2) - uVar42), uVar20 = uVar44,
                 (ulong *)((long)puVar34 + uVar44) == iEnd)) goto LAB_00663720;
            }
          }
          else {
            puVar31 = (ulong *)(pBVar32 + uVar44);
            if (*(BYTE *)(uVar20 + (long)puVar31) == *(BYTE *)((long)puVar34 + uVar20)) {
              puVar23 = puVar34;
              if (puVar34 < puVar1) {
                if (*puVar31 == uVar18) {
                  lVar39 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_160 + lVar39 + 10);
                    if (puVar1 <= puVar23) {
                      puVar31 = (ulong *)(pBVar32 + lVar39 + uVar44 + 8);
                      goto LAB_00663372;
                    }
                    lVar16 = lVar39 + uVar44 + 8;
                    lVar39 = lVar39 + 8;
                  } while (*(ulong *)(pBVar32 + lVar16) == *puVar23);
                  uVar21 = *puVar23 ^ *(ulong *)(pBVar32 + lVar16);
                  uVar44 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar44 = (uVar44 >> 3 & 0x1fffffff) + lVar39;
                }
                else {
                  uVar21 = *puVar31 ^ uVar18;
                  uVar44 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar44 & 1) == 0; uVar44 = uVar44 + 1) {
                    }
                  }
                  uVar44 = uVar44 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_00663372:
                if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                }
                uVar44 = (long)puVar23 - (long)puVar34;
              }
              goto LAB_006633ba;
            }
          }
          uVar44 = uVar20;
          if ((uVar42 <= uVar28) ||
             ((iVar48 = iVar48 + -1, iVar48 == 0 ||
              (uVar42 = pUVar13[uVar42 & uVar38 - 1], uVar20 = uVar44, uVar42 < UVar27))))
          goto LAB_00663720;
        } while( true );
      }
    }
    else {
      bVar7 = (byte)(ms->cParams).chainLog;
      uVar38 = 1 << (bVar7 & 0x1f);
      pBVar32 = (ms->window).base;
      uVar28 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      UVar37 = (ms->window).lowLimit;
      uVar46 = (uint)((long)puVar34 - (long)pBVar32);
      UVar27 = uVar46 - uVar28;
      if (uVar46 - UVar37 <= uVar28) {
        UVar27 = UVar37;
      }
      pUVar13 = ms->chainTable;
      pBVar24 = (ms->window).dictBase;
      if (ms->loadedDictEnd != 0) {
        UVar27 = UVar37;
      }
      uVar28 = uVar46 - uVar38;
      if (uVar46 < uVar38) {
        uVar28 = 0;
      }
      iVar48 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
      uVar41 = (ms->window).dictLimit;
      pUVar14 = ms->hashTable;
      uVar18 = (ulong)ms->nextToUpdate;
      bVar25 = 0x20 - (char)(ms->cParams).hashLog;
      if (ms->nextToUpdate < uVar46) {
        do {
          uVar42 = (uint)(*(int *)(pBVar32 + uVar18) * -0x61c8864f) >> (bVar25 & 0x1f);
          pUVar13[(uint)uVar18 & ~(-1 << (bVar7 & 0x1f))] = pUVar14[uVar42];
          pUVar14[uVar42] = (uint)uVar18;
          uVar18 = uVar18 + 1;
        } while (uVar18 < ((long)puVar34 - (long)pBVar32 & 0xffffffffU));
      }
      ms->nextToUpdate = uVar46;
      iVar36 = *(int *)puVar34;
      uVar42 = pUVar14[(uint)(iVar36 * -0x61c8864f) >> (bVar25 & 0x1f)];
      if (UVar27 <= uVar42) {
        local_150 = 999999999;
        uVar18 = 3;
        do {
          uVar20 = (ulong)uVar42;
          if (uVar42 < uVar41) {
            if (*(int *)(pBVar24 + uVar20) == iVar36) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_160 + 6),pBVar24 + uVar20 + 4,(BYTE *)iEnd,
                                  pBVar24 + uVar41,pBVar32 + uVar41);
              uVar44 = sVar19 + 4;
LAB_006636d2:
              if ((uVar18 < uVar44) &&
                 (local_150 = (ulong)((uVar46 + 2) - uVar42), uVar18 = uVar44,
                 (ulong *)((long)puVar34 + uVar44) == iEnd)) goto LAB_00663720;
            }
          }
          else {
            puVar31 = (ulong *)(pBVar32 + uVar20);
            if (*(BYTE *)(uVar18 + (long)puVar31) == *(BYTE *)((long)puVar34 + uVar18)) {
              puVar23 = puVar34;
              if (puVar34 < puVar1) {
                if (*puVar31 == *puVar34) {
                  lVar39 = 0;
                  do {
                    puVar23 = (ulong *)((long)local_160 + lVar39 + 10);
                    if (puVar1 <= puVar23) {
                      puVar31 = (ulong *)(pBVar32 + lVar39 + uVar20 + 8);
                      goto LAB_0066368a;
                    }
                    lVar16 = lVar39 + uVar20 + 8;
                    lVar39 = lVar39 + 8;
                  } while (*(ulong *)(pBVar32 + lVar16) == *puVar23);
                  uVar44 = *puVar23 ^ *(ulong *)(pBVar32 + lVar16);
                  uVar20 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar44 = (uVar20 >> 3 & 0x1fffffff) + lVar39;
                }
                else {
                  uVar44 = *puVar34 ^ *puVar31;
                  uVar20 = 0;
                  if (uVar44 != 0) {
                    for (; (uVar44 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  uVar44 = uVar20 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_0066368a:
                if ((puVar23 < puVar2) && ((int)*puVar31 == (int)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 4);
                  puVar31 = (ulong *)((long)puVar31 + 4);
                }
                if ((puVar23 < puVar3) && ((short)*puVar31 == (short)*puVar23)) {
                  puVar23 = (ulong *)((long)puVar23 + 2);
                  puVar31 = (ulong *)((long)puVar31 + 2);
                }
                if (puVar23 < iEnd) {
                  puVar23 = (ulong *)((long)puVar23 + (ulong)((BYTE)*puVar31 == (BYTE)*puVar23));
                }
                uVar44 = (long)puVar23 - (long)puVar34;
              }
              goto LAB_006636d2;
            }
          }
          uVar44 = uVar18;
          if ((uVar42 <= uVar28) ||
             ((iVar48 = iVar48 + -1, iVar48 == 0 ||
              (uVar42 = pUVar13[uVar42 & uVar38 - 1], uVar18 = uVar44, uVar42 < UVar27))))
          goto LAB_00663720;
        } while( true );
      }
    }
  }
  goto LAB_006637f4;
LAB_00663720:
  if (uVar44 < 4) goto LAB_006637f4;
  uVar28 = (int)local_e0 + 1;
  uVar46 = 0x1f;
  if (uVar28 != 0) {
    for (; uVar28 >> uVar46 == 0; uVar46 = uVar46 - 1) {
    }
  }
  uVar28 = (int)local_150 + 1;
  iVar48 = 0x1f;
  if (uVar28 != 0) {
    for (; uVar28 >> iVar48 == 0; iVar48 = iVar48 + -1) {
    }
  }
  if ((int)uVar44 * 4 - iVar48 <= (int)((uVar46 ^ 0x1f) + (int)local_100 * 4 + -0x18))
  goto LAB_006637f4;
LAB_0066377f:
  iVar48 = iVar45;
  local_160 = puVar34;
  local_e0 = local_150;
  puVar30 = local_160;
  local_100 = uVar44;
  if (puVar6 <= local_160) goto LAB_006637f4;
  goto LAB_00662189;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2);
}